

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

wstring_view __thiscall
mjs::string_object::handle_array_like_access(string_object *this,wstring_view property_name)

{
  ulong uVar1;
  size_type sVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  wstring_view wVar4;
  undefined1 local_48 [8];
  wstring_view v;
  uint32_t index;
  string_object *this_local;
  wstring_view property_name_local;
  
  property_name_local._M_len = (size_t)property_name._M_str;
  this_local = (string_object *)property_name._M_len;
  if (((this->is_v5_or_later_ & 1U) != 0) &&
     (v._M_str._4_4_ = index_value_from_string((wstring_view *)&this_local),
     v._M_str._4_4_ != 0xffffffff)) {
    _local_48 = view(this);
    uVar1 = (ulong)v._M_str._4_4_;
    sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_48);
    if (uVar1 < sVar2) {
      bVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_48,
                         (ulong)v._M_str._4_4_,1);
      wVar4._M_len = bVar3._M_len;
      wVar4._M_str = bVar3._M_str;
      return wVar4;
    }
  }
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&property_name_local._M_str);
  return stack0xffffffffffffffe8;
}

Assistant:

std::wstring_view handle_array_like_access(const std::wstring_view property_name) const {
        if (is_v5_or_later_) {
            if (const uint32_t index = index_value_from_string(property_name); index != invalid_index_value) {
                auto v = view();
                if (index < v.length()) {
                    return v.substr(index, 1);
                }
            }
        }
        return {};
    }